

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O0

void kiss_fft_stride(kiss_fft_cfg st,kiss_fft_cpx *fin,kiss_fft_cpx *fout,int in_stride)

{
  void *__src;
  void *in_RDX;
  void *in_RSI;
  kiss_fft_cfg in_RDI;
  kiss_fft_cpx *tmpbuf;
  
  if (in_RSI == in_RDX) {
    __src = malloc((long)in_RDI->nfft << 3);
    kf_work((kiss_fft_cpx *)st,fin,(size_t)fout,in_stride,(int *)tmpbuf,in_RDI);
    memcpy(in_RDX,__src,(long)in_RDI->nfft << 3);
    free(__src);
  }
  else {
    kf_work((kiss_fft_cpx *)st,fin,(size_t)fout,in_stride,(int *)tmpbuf,in_RDI);
  }
  return;
}

Assistant:

void kiss_fft_stride(kiss_fft_cfg st,const kiss_fft_cpx *fin,kiss_fft_cpx *fout,int in_stride)
{
    if (fin == fout) {
        //NOTE: this is not really an in-place FFT algorithm.
        //It just performs an out-of-place FFT into a temp buffer
        kiss_fft_cpx * tmpbuf = (kiss_fft_cpx*)KISS_FFT_TMP_ALLOC( sizeof(kiss_fft_cpx)*st->nfft);
        kf_work(tmpbuf,fin,1,in_stride, st->factors,st);
        memcpy(fout,tmpbuf,sizeof(kiss_fft_cpx)*st->nfft);
        KISS_FFT_TMP_FREE(tmpbuf);
    }else{
        kf_work( fout, fin, 1,in_stride, st->factors,st );
    }
}